

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

int Cloud_SharingSize(CloudManager *dd,CloudNode **pn,int nn)

{
  int iVar1;
  int local_24;
  int local_20;
  int i;
  int res;
  int nn_local;
  CloudNode **pn_local;
  CloudManager *dd_local;
  
  local_20 = 0;
  for (local_24 = 0; local_24 < nn; local_24 = local_24 + 1) {
    iVar1 = cloudDagSize(dd,(CloudNode *)((ulong)pn[local_24] & 0xfffffffffffffffe));
    local_20 = iVar1 + local_20;
  }
  for (local_24 = 0; local_24 < nn; local_24 = local_24 + 1) {
    cloudClearMark(dd,(CloudNode *)((ulong)pn[local_24] & 0xfffffffffffffffe));
  }
  return local_20;
}

Assistant:

int Cloud_SharingSize( CloudManager * dd, CloudNode ** pn, int nn )
{
    int res, i;
    res = 0;
    for ( i = 0; i < nn; i++ )
        res += cloudDagSize( dd, Cloud_Regular( pn[i] ) );
    for ( i = 0; i < nn; i++ )
        cloudClearMark( dd, Cloud_Regular( pn[i] ) );
    return res;
}